

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O0

Cube * CubeExtract(Cube *p)

{
  Cube *p_local;
  
  if (p->ID != '\0') {
    if (s_List == p) {
      s_List = p->Next;
    }
    else {
      p->Prev->Next = p->Next;
    }
    if (p->Next != (cube *)0x0) {
      p->Next->Prev = p->Prev;
    }
    p->Prev = (cube *)0x0;
    p->Next = (cube *)0x0;
    g_CoverInfo.nCubesInUse = g_CoverInfo.nCubesInUse + -1;
    return p;
  }
  __assert_fail("p->ID",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorList.c"
                ,0x34f,"Cube *CubeExtract(Cube *)");
}

Assistant:

Cube* CubeExtract( Cube* p )
// extracts the cube from storage
{
//  assert( p->Prev && p->Next ); // can be done only with rings
    assert( p->ID );

//  if ( s_List == p )
//      s_List = p->Next;
//  if ( p->Prev )
//      p->Prev->Next = p->Next;

    if ( s_List == p )
        s_List = p->Next;
    else
        p->Prev->Next = p->Next;

    if ( p->Next )
        p->Next->Prev = p->Prev;

    p->Prev = NULL;
    p->Next = NULL;

    g_CoverInfo.nCubesInUse--;
    return p;
}